

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  bool bVar1;
  int iVar2;
  mapped_type *ppcVar3;
  pointer ppVar4;
  iterator local_7c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  local_7c0;
  iterator local_7b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  local_7b0;
  const_iterator i;
  key_type local_7a0;
  allocator local_779;
  key_type local_778;
  allocator local_751;
  key_type local_750;
  allocator local_729;
  key_type local_728;
  allocator local_701;
  key_type local_700;
  allocator local_6d9;
  key_type local_6d8;
  allocator local_6b1;
  key_type local_6b0;
  allocator local_689;
  key_type local_688;
  allocator local_661;
  key_type local_660;
  allocator local_639;
  key_type local_638;
  allocator local_611;
  key_type local_610;
  allocator local_5e9;
  key_type local_5e8;
  allocator local_5c1;
  key_type local_5c0;
  allocator local_599;
  key_type local_598;
  allocator local_571;
  key_type local_570;
  allocator local_549;
  key_type local_548;
  allocator local_521;
  key_type local_520;
  allocator local_4f9;
  key_type local_4f8;
  allocator local_4d1;
  key_type local_4d0;
  allocator local_4a9;
  key_type local_4a8;
  allocator local_481;
  key_type local_480;
  allocator local_459;
  key_type local_458;
  allocator local_431;
  key_type local_430;
  allocator local_409;
  key_type local_408;
  allocator local_3e1;
  key_type local_3e0;
  allocator local_3b9;
  key_type local_3b8;
  allocator local_391;
  key_type local_390;
  allocator local_369;
  key_type local_368;
  allocator local_341;
  key_type local_340;
  allocator local_319;
  key_type local_318;
  allocator local_2f1;
  key_type local_2f0;
  allocator local_2c9;
  key_type local_2c8;
  allocator local_2a1;
  key_type local_2a0;
  allocator local_279;
  key_type local_278;
  allocator local_251;
  key_type local_250;
  allocator local_229;
  key_type local_228;
  allocator local_201;
  key_type local_200;
  allocator local_1d9;
  key_type local_1d8;
  allocator local_1b1;
  key_type local_1b0;
  allocator local_189;
  key_type local_188;
  allocator local_161;
  key_type local_160;
  allocator local_139;
  key_type local_138;
  allocator local_111;
  key_type local_110;
  allocator local_e9;
  key_type local_e8;
  allocator local_c1;
  key_type local_c0;
  allocator local_99;
  key_type local_98;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  string *local_18;
  string *identifier_local;
  
  local_18 = identifier;
  if ((GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_),
     iVar2 != 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
    ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                 ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
  }
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::empty(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"0",&local_39);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_38);
    *ppcVar3 = &zeroNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"1",&local_71);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_70);
    *ppcVar3 = &oneNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"AND",&local_99);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_98);
    *ppcVar3 = &andNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"OR",&local_c1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_c0);
    *ppcVar3 = &orNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"NOT",&local_e9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_e8);
    *ppcVar3 = &notNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"C_COMPILER_ID",&local_111);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_110);
    *ppcVar3 = (mapped_type)&cCompilerIdNode;
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"CXX_COMPILER_ID",&local_139);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_138);
    *ppcVar3 = (mapped_type)&cxxCompilerIdNode;
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"VERSION_GREATER",&local_161);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_160);
    *ppcVar3 = &versionGreaterNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"VERSION_LESS",&local_189);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_188);
    *ppcVar3 = &versionLessNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"VERSION_EQUAL",&local_1b1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_1b0);
    *ppcVar3 = &versionEqualNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"C_COMPILER_VERSION",&local_1d9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_1d8);
    *ppcVar3 = (mapped_type)&cCompilerVersionNode;
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"CXX_COMPILER_VERSION",&local_201);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_200);
    *ppcVar3 = (mapped_type)&cxxCompilerVersionNode;
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_228,"PLATFORM_ID",&local_229);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_228);
    *ppcVar3 = &platformIdNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"COMPILE_FEATURES",&local_251);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_250);
    *ppcVar3 = &compileFeaturesNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"CONFIGURATION",&local_279);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_278);
    *ppcVar3 = &configurationNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"CONFIG",&local_2a1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_2a0);
    *ppcVar3 = &configurationTestNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"TARGET_FILE",&local_2c9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_2c8);
    *ppcVar3 = (mapped_type)&targetNodeGroup;
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"TARGET_LINKER_FILE",&local_2f1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_2f0);
    *ppcVar3 = (mapped_type)&targetLinkerNodeGroup;
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"TARGET_SONAME_FILE",&local_319);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_318);
    *ppcVar3 = (mapped_type)&targetSoNameNodeGroup;
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"TARGET_PDB_FILE",&local_341);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_340);
    *ppcVar3 = (mapped_type)&targetPdbNodeGroup;
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"TARGET_FILE_NAME",&local_369);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_368);
    *ppcVar3 = &targetNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"TARGET_LINKER_FILE_NAME",&local_391);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_390);
    *ppcVar3 = &targetLinkerNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"TARGET_SONAME_FILE_NAME",&local_3b9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_3b8);
    *ppcVar3 = &targetSoNameNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"TARGET_PDB_FILE_NAME",&local_3e1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_3e0);
    *ppcVar3 = &targetPdbNodeGroup.FileName.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"TARGET_FILE_DIR",&local_409);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_408);
    *ppcVar3 = &targetNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"TARGET_LINKER_FILE_DIR",&local_431);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_430);
    *ppcVar3 = &targetLinkerNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"TARGET_SONAME_FILE_DIR",&local_459);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_458);
    *ppcVar3 = &targetSoNameNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"TARGET_PDB_FILE_DIR",&local_481);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_480);
    *ppcVar3 = &targetPdbNodeGroup.FileDir.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a8,"STREQUAL",&local_4a9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_4a8);
    *ppcVar3 = &strEqualNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d0,"EQUAL",&local_4d1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_4d0);
    *ppcVar3 = &equalNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4f8,"LOWER_CASE",&local_4f9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_4f8);
    *ppcVar3 = &lowerCaseNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"UPPER_CASE",&local_521);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_520);
    *ppcVar3 = &upperCaseNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"MAKE_C_IDENTIFIER",&local_549);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_548);
    *ppcVar3 = &makeCIdentifierNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_570,"BOOL",&local_571);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_570);
    *ppcVar3 = &boolNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_598,"ANGLE-R",&local_599);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_598);
    *ppcVar3 = &angle_rNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c0,"COMMA",&local_5c1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_5c0);
    *ppcVar3 = &commaNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5e8,"SEMICOLON",&local_5e9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_5e8);
    *ppcVar3 = &semicolonNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_610,"TARGET_PROPERTY",&local_611);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_610);
    *ppcVar3 = &targetPropertyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_638,"TARGET_NAME",&local_639);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_638);
    *ppcVar3 = &targetNameNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"TARGET_OBJECTS",&local_661);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_660);
    *ppcVar3 = &targetObjectsNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"TARGET_POLICY",&local_689);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_688);
    *ppcVar3 = &targetPolicyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"BUILD_INTERFACE",&local_6b1);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_6b0);
    *ppcVar3 = &buildInterfaceNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"INSTALL_INTERFACE",&local_6d9);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_6d8);
    *ppcVar3 = &installInterfaceNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"INSTALL_PREFIX",&local_701);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_700);
    *ppcVar3 = &installPrefixNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_728,"JOIN",&local_729);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_728);
    *ppcVar3 = &joinNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_750,"LINK_ONLY",&local_751);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_750);
    *ppcVar3 = &linkOnlyNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"COMPILE_LANGUAGE",&local_779);
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_778);
    *ppcVar3 = &languageNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_7a0,"SHELL_PATH",(allocator *)((long)&i._M_node + 7));
    ppcVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
              ::operator[](&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&local_7a0);
    *ppcVar3 = &shellPathNode.super_cmGeneratorExpressionNode;
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_node + 7));
  }
  local_7b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
       ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,local_18);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  ::_Rb_tree_const_iterator(&local_7b0,&local_7b8);
  local_7c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
       ::end(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  ::_Rb_tree_const_iterator(&local_7c0,&local_7c8);
  bVar1 = std::operator==(&local_7b0,&local_7c0);
  if (bVar1) {
    identifier_local = (string *)0x0;
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
             ::operator->(&local_7b0);
    identifier_local = (string *)ppVar4->second;
  }
  return (cmGeneratorExpressionNode *)identifier_local;
}

Assistant:

const cmGeneratorExpressionNode*
cmGeneratorExpressionNode::GetNode(const std::string &identifier)
{
  typedef std::map<std::string, const cmGeneratorExpressionNode*> NodeMap;
  static NodeMap nodeMap;
  if (nodeMap.empty())
    {
    nodeMap["0"] = &zeroNode;
    nodeMap["1"] = &oneNode;
    nodeMap["AND"] = &andNode;
    nodeMap["OR"] = &orNode;
    nodeMap["NOT"] = &notNode;
    nodeMap["C_COMPILER_ID"] = &cCompilerIdNode;
    nodeMap["CXX_COMPILER_ID"] = &cxxCompilerIdNode;
    nodeMap["VERSION_GREATER"] = &versionGreaterNode;
    nodeMap["VERSION_LESS"] = &versionLessNode;
    nodeMap["VERSION_EQUAL"] = &versionEqualNode;
    nodeMap["C_COMPILER_VERSION"] = &cCompilerVersionNode;
    nodeMap["CXX_COMPILER_VERSION"] = &cxxCompilerVersionNode;
    nodeMap["PLATFORM_ID"] = &platformIdNode;
    nodeMap["COMPILE_FEATURES"] = &compileFeaturesNode;
    nodeMap["CONFIGURATION"] = &configurationNode;
    nodeMap["CONFIG"] = &configurationTestNode;
    nodeMap["TARGET_FILE"] = &targetNodeGroup.File;
    nodeMap["TARGET_LINKER_FILE"] = &targetLinkerNodeGroup.File;
    nodeMap["TARGET_SONAME_FILE"] = &targetSoNameNodeGroup.File;
    nodeMap["TARGET_PDB_FILE"] = &targetPdbNodeGroup.File;
    nodeMap["TARGET_FILE_NAME"] = &targetNodeGroup.FileName;
    nodeMap["TARGET_LINKER_FILE_NAME"] = &targetLinkerNodeGroup.FileName;
    nodeMap["TARGET_SONAME_FILE_NAME"] = &targetSoNameNodeGroup.FileName;
    nodeMap["TARGET_PDB_FILE_NAME"] = &targetPdbNodeGroup.FileName;
    nodeMap["TARGET_FILE_DIR"] = &targetNodeGroup.FileDir;
    nodeMap["TARGET_LINKER_FILE_DIR"] = &targetLinkerNodeGroup.FileDir;
    nodeMap["TARGET_SONAME_FILE_DIR"] = &targetSoNameNodeGroup.FileDir;
    nodeMap["TARGET_PDB_FILE_DIR"] = &targetPdbNodeGroup.FileDir;
    nodeMap["STREQUAL"] = &strEqualNode;
    nodeMap["EQUAL"] = &equalNode;
    nodeMap["LOWER_CASE"] = &lowerCaseNode;
    nodeMap["UPPER_CASE"] = &upperCaseNode;
    nodeMap["MAKE_C_IDENTIFIER"] = &makeCIdentifierNode;
    nodeMap["BOOL"] = &boolNode;
    nodeMap["ANGLE-R"] = &angle_rNode;
    nodeMap["COMMA"] = &commaNode;
    nodeMap["SEMICOLON"] = &semicolonNode;
    nodeMap["TARGET_PROPERTY"] = &targetPropertyNode;
    nodeMap["TARGET_NAME"] = &targetNameNode;
    nodeMap["TARGET_OBJECTS"] = &targetObjectsNode;
    nodeMap["TARGET_POLICY"] = &targetPolicyNode;
    nodeMap["BUILD_INTERFACE"] = &buildInterfaceNode;
    nodeMap["INSTALL_INTERFACE"] = &installInterfaceNode;
    nodeMap["INSTALL_PREFIX"] = &installPrefixNode;
    nodeMap["JOIN"] = &joinNode;
    nodeMap["LINK_ONLY"] = &linkOnlyNode;
    nodeMap["COMPILE_LANGUAGE"] = &languageNode;
    nodeMap["SHELL_PATH"] = &shellPathNode;
    }
  NodeMap::const_iterator i = nodeMap.find(identifier);
  if (i == nodeMap.end())
    {
    return 0;
    }
  return i->second;
}